

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

string * __thiscall
cmFindProgramCommand::FindAppBundle
          (string *__return_storage_ptr__,cmFindProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  string bundlePath;
  string *this_00;
  pointer __lhs;
  string executable;
  string appPath;
  string appName;
  string local_50 [32];
  
  __lhs = (names->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs == (names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&appName);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&appPath,".app",(allocator *)&executable);
    std::operator+(&appName,__lhs,&appPath);
    std::__cxx11::string::~string((string *)&appPath);
    cmsys::SystemTools::FindDirectory
              (&appPath,&appName,&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,true);
    if (appPath._M_string_length != 0) {
      this_00 = &appPath;
      std::__cxx11::string::string(local_50,(string *)&appPath);
      bundlePath._M_string_length = (size_type)executable._M_dataplus._M_p;
      bundlePath._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      bundlePath.field_2._M_allocated_capacity = executable._M_string_length;
      bundlePath.field_2._8_8_ = executable.field_2._M_allocated_capacity;
      GetBundleExecutable(&executable,(cmFindProgramCommand *)this_00,bundlePath);
      std::__cxx11::string::~string(local_50);
      if (executable._M_string_length != 0) {
        cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&executable);
        std::__cxx11::string::~string((string *)&executable);
        std::__cxx11::string::~string((string *)&appPath);
        std::__cxx11::string::~string((string *)&appName);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::~string((string *)&executable);
    }
    std::__cxx11::string::~string((string *)&appPath);
    std::__cxx11::string::~string((string *)&appName);
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

std::string cmFindProgramCommand
::FindAppBundle(std::vector<std::string> names)
{
  for(std::vector<std::string>::const_iterator name = names.begin();
      name != names.end() ; ++name)
    {

    std::string appName = *name + std::string(".app");
    std::string appPath = cmSystemTools::FindDirectory(appName,
                                                       this->SearchPaths,
                                                       true);

    if ( !appPath.empty() )
      {
      std::string executable = GetBundleExecutable(appPath);
      if (!executable.empty())
        {
        return cmSystemTools::CollapseFullPath(executable);
        }
      }
    }

  // Couldn't find app bundle
  return "";
}